

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

CURLcode Curl_add_timecondition(Curl_easy *data,Curl_send_buffer *req_buffer)

{
  curl_TimeCond cVar1;
  char *buffer;
  CURLcode CVar2;
  int iVar3;
  char *fmt;
  tm keeptime;
  
  if ((data->set).timecondition == CURL_TIMECOND_NONE) {
    CVar2 = CURLE_OK;
  }
  else {
    buffer = (data->state).buffer;
    CVar2 = Curl_gmtime((data->set).timevalue,&keeptime);
    if (CVar2 == CURLE_OK) {
      iVar3 = 6;
      if (keeptime.tm_wday != 0) {
        iVar3 = keeptime.tm_wday + -1;
      }
      curl_msnprintf(buffer,0x3fff,"%s, %02d %s %4d %02d:%02d:%02d GMT",Curl_wkday[iVar3],
                     (ulong)(uint)keeptime.tm_mday,Curl_month[keeptime.tm_mon],
                     (ulong)(keeptime.tm_year + 0x76c),(ulong)(uint)keeptime.tm_hour,
                     (ulong)(uint)keeptime.tm_min,(ulong)(uint)keeptime.tm_sec);
      cVar1 = (data->set).timecondition;
      if (cVar1 == CURL_TIMECOND_LASTMOD) {
        fmt = "Last-Modified: %s\r\n";
      }
      else if (cVar1 == CURL_TIMECOND_IFUNMODSINCE) {
        fmt = "If-Unmodified-Since: %s\r\n";
      }
      else {
        if (cVar1 != CURL_TIMECOND_IFMODSINCE) {
          return CURLE_OK;
        }
        fmt = "If-Modified-Since: %s\r\n";
      }
      CVar2 = Curl_add_bufferf(req_buffer,fmt,buffer);
    }
    else {
      Curl_failf(data,"Invalid TIMEVALUE");
    }
  }
  return CVar2;
}

Assistant:

CURLcode Curl_add_timecondition(struct Curl_easy *data,
                                Curl_send_buffer *req_buffer)
{
  const struct tm *tm;
  char *buf = data->state.buffer;
  struct tm keeptime;
  CURLcode result;

  if(data->set.timecondition == CURL_TIMECOND_NONE)
    /* no condition was asked for */
    return CURLE_OK;

  result = Curl_gmtime(data->set.timevalue, &keeptime);
  if(result) {
    failf(data, "Invalid TIMEVALUE");
    return result;
  }
  tm = &keeptime;

  /* The If-Modified-Since header family should have their times set in
   * GMT as RFC2616 defines: "All HTTP date/time stamps MUST be
   * represented in Greenwich Mean Time (GMT), without exception. For the
   * purposes of HTTP, GMT is exactly equal to UTC (Coordinated Universal
   * Time)." (see page 20 of RFC2616).
   */

  /* format: "Tue, 15 Nov 1994 12:45:26 GMT" */
  snprintf(buf, BUFSIZE-1,
           "%s, %02d %s %4d %02d:%02d:%02d GMT",
           Curl_wkday[tm->tm_wday?tm->tm_wday-1:6],
           tm->tm_mday,
           Curl_month[tm->tm_mon],
           tm->tm_year + 1900,
           tm->tm_hour,
           tm->tm_min,
           tm->tm_sec);

  switch(data->set.timecondition) {
  default:
    break;
  case CURL_TIMECOND_IFMODSINCE:
    result = Curl_add_bufferf(req_buffer,
                              "If-Modified-Since: %s\r\n", buf);
    break;
  case CURL_TIMECOND_IFUNMODSINCE:
    result = Curl_add_bufferf(req_buffer,
                              "If-Unmodified-Since: %s\r\n", buf);
    break;
  case CURL_TIMECOND_LASTMOD:
    result = Curl_add_bufferf(req_buffer,
                              "Last-Modified: %s\r\n", buf);
    break;
  }

  return result;
}